

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall Printer::PrintHeader(Printer *this,ostream *c)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int local_38;
  
  iVar2 = 0;
  for (lVar4 = 0; lVar4 < this->attrCount; lVar4 = lVar4 + 1) {
    std::operator<<(c,this->psHeader[lVar4]);
    sVar1 = strlen(this->psHeader[lVar4]);
    for (iVar3 = 0; iVar3 < this->spaces[lVar4]; iVar3 = iVar3 + 1) {
      std::operator<<(c," ");
    }
    local_38 = (int)sVar1;
    iVar2 = iVar2 + local_38 + this->spaces[lVar4];
  }
  std::operator<<(c,"\n");
  iVar3 = 0;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  while (iVar3 != 0) {
    std::operator<<(c,"-");
    iVar3 = iVar3 + -1;
  }
  std::operator<<(c,"\n");
  return;
}

Assistant:

void Printer::PrintHeader( ostream &c ) const
{
    int dashes = 0;
    int iLen;
    int i,j;

    for (i = 0; i < attrCount; i++) {
        // Print out the header information name
        c << psHeader[i];
        iLen = strlen(psHeader[i]);
        dashes += iLen;

        for (j = 0; j < spaces[i]; j++)
            c << " ";

        dashes += spaces[i];
    }

    c << "\n";
    for (i = 0; i < dashes; i++) c << "-";
    c << "\n";
}